

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::SimpleTypeHandler<3UL>::GetSetter
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  BOOL BVar2;
  ulong in_RAX;
  DescriptorFlags DVar3;
  undefined8 local_38;
  uint32 indexVal;
  PropertyIndex index;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  local_38 = in_RAX;
  BVar2 = GetDescriptor(this,propertyId,(PropertyIndex *)((long)&local_38 + 6));
  if (BVar2 == 0) {
    BVar2 = ScriptContext::IsNumericPropertyId
                      ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId,(uint32 *)&local_38
                      );
    if (BVar2 == 0) {
      DVar3 = None;
    }
    else {
      DVar3 = DynamicTypeHandler::GetItemSetter
                        (&this->super_DynamicTypeHandler,instance,(uint32)local_38,setterValue,
                         requestContext);
    }
  }
  else {
    bVar1 = this->descriptors[local_38 >> 0x30].field_1.Attributes;
    DVar3 = None;
    if ((bVar1 & 8) == 0) {
      DVar3 = bVar1 & Writable | Data;
    }
  }
  return DVar3;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index;
        PropertyValueInfo::SetNoCache(info, instance);
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                return None;
            }
            return (descriptors[index].Attributes & PropertyWritable) ? WritableData : Data;
        }

        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItemSetter(instance, indexVal, setterValue, requestContext);
        }

        return None;
    }